

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  undefined1 auVar1 [16];
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  void *pvVar5;
  pointer pLVar6;
  ctrl_t *pcVar7;
  FileDescriptor *pFVar8;
  ctrl_t *pcVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  slot_type *psVar18;
  slot_type *psVar19;
  Message **ppMVar20;
  undefined1 uVar21;
  ushort uVar22;
  ulong extraout_RAX;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  slot_type *psVar26;
  long extraout_RDX;
  uint uVar27;
  pointer pLVar28;
  ulong uVar29;
  pointer pLVar30;
  
  psVar2 = (slot_type *)a->ctrl_;
  if ((psVar2 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = (slot_type *)b->ctrl_;
    if ((psVar3 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)psVar3 < '\0')) goto LAB_0020c5ab;
    if (psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar3 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_0020c59e:
      return psVar2 == psVar3;
    }
    if ((psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
        (psVar3 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
    goto LAB_0020c5b0;
    if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_0020c59e;
    if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar4 = (b->field_1).slot_;
      if (psVar2 == (slot_type *)&kSooControl) {
        bVar25 = (slot_type *)a == psVar4;
      }
      else {
        psVar26 = psVar4;
        psVar18 = psVar3;
        psVar19 = (slot_type *)a;
        if (psVar3 < psVar2) {
          psVar26 = (slot_type *)a;
          psVar18 = psVar2;
          psVar19 = psVar4;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar18 >> 8),psVar18 < psVar19);
        bVar25 = psVar19 <= psVar26 && psVar18 < psVar19;
      }
      if (bVar25) goto LAB_0020c59e;
    }
  }
  else {
    operator==();
LAB_0020c5ab:
    operator==();
LAB_0020c5b0:
    operator==();
  }
  operator==();
  if (b == (iterator *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
    ::erase();
  }
  else if (b != (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
          ) {
    if (-1 < (char)*(code *)&b->ctrl_) {
      pvVar5 = *(void **)(extraout_RDX + 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,*(long *)(extraout_RDX + 0x18) - (long)pvVar5);
      }
      uVar21 = absl::lts_20240722::container_internal::EraseMetaOnly
                         ((CommonFields *)a,
                          (long)b - (long)(((value_type *)a)->second).
                                          super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,0x20);
      return (bool)uVar21;
    }
    goto LAB_0020c618;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
LAB_0020c618:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
  ::erase();
  pLVar6 = (((value_type *)a)->second).
           super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar23 = extraout_RAX;
  if ((pointer)0x1 < pLVar6) {
    pcVar7 = b->ctrl_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)pcVar7);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         pcVar7 + (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0) ^
                  SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar23 = SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0);
    pFVar8 = ((value_type *)a)->first;
    if (pFVar8 < (FileDescriptor *)0x11) {
      uVar24 = SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8) ^ uVar23;
      pLVar30 = (((value_type *)a)->second).
                super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pLVar28 = (((value_type *)a)->second).
                super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (pFVar8 < (FileDescriptor *)0xf) {
        if ((FileDescriptor *)0x8 < pFVar8) {
          __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x753,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                       );
        }
        uVar23 = 0x8080808080808080;
        uVar29 = *(ulong *)((long)&pLVar30->proto_features + (long)pFVar8) & 0x8080808080808080;
        if (uVar29 != 0x8080808080808080) {
          uVar29 = uVar29 ^ 0x8080808080808080;
          do {
            lVar11 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar11 & 1) == 0; lVar11 = lVar11 + 1) {
              }
            }
            pcVar9 = *(ctrl_t **)((long)pLVar28 + (ulong)((uint)lVar11 & 0xfffffff8) * 4 + -0x20);
            if ((pcVar9 == pcVar7) &&
               (auVar14._8_8_ = 0,
               auVar14._0_8_ =
                    (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)pcVar9),
               auVar15._8_8_ = 0,
               auVar15._0_8_ =
                    pcVar9 + (SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),0) ^
                             SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),8)),
               uVar24 != (SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),8) ^
                         SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),0)))) {
LAB_0020c78a:
              __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf1b,
                            "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>::AssertHashEqConsistent(const google::protobuf::FileDescriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Hash = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FileDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FileDescriptor *const, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>]"
                           );
            }
            uVar23 = uVar29 - 1;
            uVar29 = uVar29 & uVar23;
          } while (uVar29 != 0);
        }
      }
      else {
        uVar29 = (ulong)pLVar6 >> 1;
        while( true ) {
          auVar1._0_8_ = pLVar30->proto_features;
          auVar1._8_8_ = pLVar30->proto;
          uVar27 = (uint)(ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)((ulong)auVar1._8_8_ >> 0x3f) << 0xf);
          if (uVar27 != 0xffff) {
            uVar27 = ~uVar27;
            do {
              uVar10 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              if (*(char *)((long)&pLVar30->proto_features + (ulong)uVar10) < '\0') {
                __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x764,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                             );
              }
              pcVar9 = *(ctrl_t **)((long)&pLVar28->proto_features + (ulong)(uVar10 << 5));
              if ((pcVar9 == pcVar7) &&
                 (auVar16._8_8_ = 0,
                 auVar16._0_8_ =
                      (ctrl_t *)((long)&hash_internal::MixingHashState::kSeed + (long)pcVar9),
                 auVar17._8_8_ = 0,
                 auVar17._0_8_ =
                      pcVar9 + (SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),0) ^
                               SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),8)),
                 uVar24 != (SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),8) ^
                           SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),0)))) goto LAB_0020c78a;
              uVar29 = uVar29 - 1;
              uVar22 = (ushort)(uVar27 - 1) & (ushort)uVar27;
              uVar27 = CONCAT22((short)(uVar27 - 1 >> 0x10),uVar22);
              uVar23 = (ulong)uVar27;
            } while (uVar22 != 0);
          }
          if (uVar29 == 0) break;
          pLVar28 = (pointer)&pLVar28[10].filename;
          ppMVar20 = &pLVar30->proto;
          pLVar30 = (pointer)&pLVar30->full_name;
          if (*(char *)((long)ppMVar20 + 7) == -1) {
            __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x76b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = absl::container_internal::map_slot_type<const google::protobuf::FileDescriptor *, std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  return SUB81(uVar23,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }